

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deriv.c
# Opt level: O2

void solv_diffeq(Item *qsol,Symbol *fun,Symbol *method,int numeqn,int listnum,int steadystate,
                int btype)

{
  bool bVar1;
  List *pLVar2;
  int iVar3;
  Item *pIVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  char ssprefix [8];
  char dindepname [50];
  
  uVar7 = (ulong)(uint)listnum;
  uVar6 = (ulong)(uint)numeqn;
  if ((method != (Symbol *)0x0) && (iVar3 = strcmp(method->name,"cnexp"), iVar3 == 0)) {
    sprintf(buf," %s();\n",fun->name);
    replacstr(qsol,buf);
    sprintf(buf," %s(_threadargs_);\n",fun->name);
    vectorize_substitute(qsol,buf);
    return;
  }
  if (steadystate == 0) {
    ssprefix._0_4_ = ssprefix._0_4_ & 0xffffff00;
  }
  else {
    builtin_strncpy(ssprefix,"_ss_",5);
  }
  sprintf(dindepname,"d%s",indepsym->name);
  if ((fun->subtype & 0x400) != 0) {
    if ((method->subtype & 0x200) == 0) {
      kinetic_implicit(fun,dindepname,method->name);
    }
    else {
      kinetic_intmethod(fun,method->name);
    }
  }
  save_dt(qsol);
  if ((method->subtype & 0x200) == 0) {
    sprintf(buf,
            "  if (!_thread[_spth%d]._pvoid) {\n    _thread[_spth%d]._pvoid = nrn_cons_sparseobj(%s%s{}, %d, _ml, _threadargs_);\n    #ifdef _OPENACC\n    if (_nt->compute_gpu) {\n      void* _d_so = cnrn_target_deviceptr(_thread[_spth%d]._pvoid);\n      ThreadDatum* _d_td = cnrn_target_deviceptr(_thread);\n      cnrn_target_memcpy_to_device(&(_d_td[_spth%d]._pvoid), &_d_so);\n    }\n    #endif\n  }\n"
            ,uVar7,uVar7,fun->name,suffix,uVar6,uVar7,uVar7);
    lappendstr(newtonspace_list,buf);
    sprintf(buf,
            "%s%s(&_sparseobj%d, %d, _slist%d, _dlist%d, _p, &%s, %s, %s,&_coef%d, _linmat%d);\n",
            ssprefix,method->name,uVar7,uVar6,uVar7,uVar7,indepsym->name,dindepname,fun->name,uVar7,
            uVar7);
  }
  else {
    if ((method->u).i == 1) {
      ifnew_parminstall("maxerr","1e-5","","");
      pcVar5 = ", maxerr";
    }
    else {
      pcVar5 = "";
    }
    pLVar2 = deriv_imp_list;
    if (deriv_imp_list != (List *)0x0) {
      bVar1 = false;
      pIVar4 = deriv_imp_list;
      while (pIVar4 = pIVar4->next, pIVar4 != pLVar2) {
        iVar3 = strcmp((pIVar4->element).str,fun->name);
        if (iVar3 == 0) {
          bVar1 = true;
        }
      }
      iVar3 = strcmp(method->name,Derivimplicit);
      if (bVar1 != (iVar3 == 0)) {
        diag("To use the derivimplicit method the SOLVE statement must precede the DERIVATIVE block\n"
             ," and all SOLVEs using that block must use the derivimplicit method\n");
      }
      derivimplic_listnum = listnum;
      sprintf(buf,"static int _deriv%d_advance = 1;\n",(ulong)(uint)listnum);
      pIVar4 = linsertstr(procfunc,buf);
      sprintf(buf,
              "\n#define _deriv%d_advance _thread[%d]._i\n#define _dith%d %d\n#define _newtonspace%d _thread[%d]._pvoid\n"
              ,(ulong)(uint)listnum,(ulong)(uint)thread_data_index,(ulong)(uint)listnum,
              (ulong)(thread_data_index + 1),uVar7,(ulong)(thread_data_index + 2));
      vectorize_substitute(pIVar4,buf);
      sprintf(buf,"  _thread[_dith%d]._pval = NULL;",(ulong)(uint)listnum);
      lappendstr(thread_mem_init_list,buf);
      sprintf(buf,
              "  if (!_newtonspace%d) {\n    _newtonspace%d = nrn_cons_newtonspace(%d, _cntml_padded);\n    _thread[_dith%d]._pval = makevector(2*%d*_cntml_padded*sizeof(double));\n    #ifdef _OPENACC\n    if (_nt->compute_gpu) {\n      void* _d_ns = cnrn_target_deviceptr(_newtonspace%d);\n      double* _d_pd = cnrn_target_copyin(_thread[_dith%d]._pval, 2*%d*_cntml_padded);\n      ThreadDatum* _d_td = cnrn_target_deviceptr(_thread);\n      cnrn_target_memcpy_to_device(&(_d_td[%d]._pvoid), &_d_ns);\n      cnrn_target_memcpy_to_device(&(_d_td[_dith%d]._pval), &_d_pd);\n    }\n    #endif\n  }\n"
              ,(ulong)(uint)listnum,(ulong)(uint)listnum,uVar6,(ulong)(uint)listnum,uVar6,uVar7,
              uVar7,uVar6,(ulong)(thread_data_index + 2),uVar7);
      lappendstr(newtonspace_list,buf);
      sprintf(buf,"  free( _thread[_dith%d]._pval);\n",uVar7);
      lappendstr(thread_cleanup_list,buf);
      sprintf(buf,"  nrn_destroy_newtonspace((NewtonSpace*) _newtonspace%d);\n",uVar7);
      lappendstr(thread_cleanup_list,buf);
      thread_data_index = thread_data_index + 3;
    }
    sprintf(buf," %s%s(_ninits, %d, _slist%d, _dlist%d, _p, &%s, %s, %s, &_temp%d%s);",ssprefix,
            method->name,uVar6,uVar7,uVar7,indepsym->name,dindepname,fun->name,uVar7,pcVar5);
  }
  replacstr(qsol,buf);
  if ((method->subtype & 0x200) == 0) {
    if (vectorize == 0) {
      return;
    }
    sprintf(buf,
            "\n  %s%s_thread(static_cast<SparseObj*>(_thread[_spth%d]._pvoid), %d, _slist%d, _dlist%d, &%s, %s, %s%s<coreneuron::scopmath::enabled_code::compute_only>{}, _linmat%d, _threadargs_);\n"
            ,ssprefix,method->name,uVar7,uVar6,uVar7,uVar7,indepsym->name,dindepname,fun->name,
            suffix,uVar7);
  }
  else {
    sprintf(buf,"\n  %s%s_thread(%d, _slist%d, _dlist%d, %s%s{}, _threadargs_);\n",ssprefix,
            method->name,uVar6,uVar7,uVar7,fun->name,suffix);
  }
  vectorize_substitute(qsol,buf);
  return;
}

Assistant:

void solv_diffeq(qsol, fun, method, numeqn, listnum, steadystate, btype)
	Item *qsol;
	Symbol *fun, *method;
	int numeqn, listnum, steadystate;
	int btype;
{
	char *maxerr_str, dindepname[50];
	char ssprefix[8];
	
	if (method && strcmp(method->name, "cnexp") == 0) {
		sprintf(buf, " %s();\n", fun->name);
		replacstr(qsol, buf);
		sprintf(buf, " %s(_threadargs_);\n", fun->name);
		vectorize_substitute(qsol, buf); 
		return;
	}
	if (steadystate) {
		Strcpy(ssprefix, "_ss_");
	}else{
		Strcpy(ssprefix, "");
	}
	Sprintf(dindepname, "d%s", indepsym->name);
	if (fun->subtype & KINF) { /* translate the kinetic equations */
		/* can be standard integrator, full matrix advancec, or
		   sparse matrix advance */
		/* at this time only sparse and standard exists */
		if (method->subtype & DERF) {
			kinetic_intmethod(fun, method->name);
		} else {
			kinetic_implicit(fun, dindepname, method->name);
		}
	}
	save_dt(qsol);
	if (method->subtype & DERF) {
		if (method->u.i == 1) { /* variable step method */
			maxerr_str = ", maxerr";
			IGNORE(ifnew_parminstall("maxerr", "1e-5", "", ""));
		} else {
			maxerr_str = "";
		}

if (deriv_imp_list) {	/* make sure deriv block translation matches method */
	Item *q; int found=0;
	ITERATE(q, deriv_imp_list) {
		if (strcmp(STR(q), fun->name) == 0) {
			found = 1;
		}
	}
	if ((strcmp(method->name, Derivimplicit) == 0) ^ (found == 1)) {
	diag("To use the derivimplicit method the SOLVE statement must\
 precede the DERIVATIVE block\n",
" and all SOLVEs using that block must use the derivimplicit method\n");
	}
	derivimplic_listnum = listnum;	
	Sprintf(buf, "static int _deriv%d_advance = 1;\n", listnum);
	q = linsertstr(procfunc, buf);
	Sprintf(buf, "\n#define _deriv%d_advance _thread[%d]._i\n\
#define _dith%d %d\n#define _newtonspace%d _thread[%d]._pvoid\n\
", listnum, thread_data_index, listnum, thread_data_index+1, listnum, thread_data_index+2);

	vectorize_substitute(q, buf);
	Sprintf(buf, "  _thread[_dith%d]._pval = NULL;", listnum);
	lappendstr(thread_mem_init_list, buf);
	Sprintf(buf,
          "  if (!_newtonspace%d) {\n"
          "    _newtonspace%d = nrn_cons_newtonspace(%d, _cntml_padded);\n"
          "    _thread[_dith%d]._pval = makevector(2*%d*_cntml_padded*sizeof(double));\n"
	  "    #ifdef _OPENACC\n"
	  "    if (_nt->compute_gpu) {\n"
	  "      void* _d_ns = cnrn_target_deviceptr(_newtonspace%d);\n"
	  "      double* _d_pd = cnrn_target_copyin(_thread[_dith%d]._pval, 2*%d*_cntml_padded);\n"
	  "      ThreadDatum* _d_td = cnrn_target_deviceptr(_thread);\n"
	  "      cnrn_target_memcpy_to_device(&(_d_td[%d]._pvoid), &_d_ns);\n"
	  "      cnrn_target_memcpy_to_device(&(_d_td[_dith%d]._pval), &_d_pd);\n"
	  "    }\n"
	  "    #endif\n"
          "  }\n"
          , listnum, listnum, numeqn, listnum, numeqn
	  , listnum, listnum, numeqn, thread_data_index+2, listnum
	  );
	lappendstr(newtonspace_list, buf);
	Sprintf(buf, "  free( _thread[_dith%d]._pval);\n", listnum);
	lappendstr(thread_cleanup_list, buf);
	Sprintf(buf, "  nrn_destroy_newtonspace((NewtonSpace*) _newtonspace%d);\n", listnum);
	lappendstr(thread_cleanup_list, buf);
	thread_data_index += 3;
}
Sprintf(buf," %s%s(_ninits, %d, _slist%d, _dlist%d, _p, &%s, %s, %s, &_temp%d%s);",
ssprefix,
method->name, numeqn, listnum, listnum, indepsym->name, dindepname,
fun->name, listnum, maxerr_str);
	}else{
	  Sprintf(buf,
	    "  if (!_thread[_spth%d]._pvoid) {\n"
	    "    _thread[_spth%d]._pvoid = nrn_cons_sparseobj(%s%s{}, %d, _ml, _threadargs_);\n"
	    "    #ifdef _OPENACC\n"
	    "    if (_nt->compute_gpu) {\n"
	    "      void* _d_so = cnrn_target_deviceptr(_thread[_spth%d]._pvoid);\n"
	    "      ThreadDatum* _d_td = cnrn_target_deviceptr(_thread);\n"
	    "      cnrn_target_memcpy_to_device(&(_d_td[_spth%d]._pvoid), &_d_so);\n"
	    "    }\n"
	    "    #endif\n"
	    "  }\n"
	    , listnum, listnum, fun->name, suffix, numeqn
	    , listnum, listnum
	    );
	  lappendstr(newtonspace_list, buf);
Sprintf(buf, "%s%s(&_sparseobj%d, %d, _slist%d, _dlist%d, _p, &%s, %s, %s\
,&_coef%d, _linmat%d);\n",
ssprefix, method->name, listnum, numeqn, listnum, listnum, indepsym->name,
dindepname, fun->name, listnum, listnum);
	}
	replacstr(qsol, buf);
#if VECTORIZE
	if (method->subtype & DERF) { /* derivimplicit */
	Sprintf(buf, "\n  %s%s_thread(%d, _slist%d, _dlist%d, %s%s{}, _threadargs_);\n",
		ssprefix, method->name, numeqn, listnum, listnum, fun->name, suffix);
	vectorize_substitute(qsol, buf);
	}else{ /* kinetic */
   if (vectorize) {
Sprintf(buf,
"\n  %s%s_thread(static_cast<SparseObj*>(_thread[_spth%d]._pvoid), %d, _slist%d, _dlist%d, &%s, %s, %s%s<coreneuron::scopmath::enabled_code::compute_only>{}, _linmat%d, _threadargs_);\n",
ssprefix, method->name, listnum, numeqn, listnum, listnum, indepsym->name,
dindepname, fun->name, suffix, listnum);
	vectorize_substitute(qsol, buf);
   }
#endif
	}
}